

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int add_value(archive_read *a,huffman_code *code,int value,int codebits,int length)

{
  uint uVar1;
  int iVar2;
  int local_34;
  int bit;
  int bitpos;
  int lastnode;
  int length_local;
  int codebits_local;
  int value_local;
  huffman_code *code_local;
  archive_read *a_local;
  
  free(code->table);
  code->table = (huffman_table_entry *)0x0;
  if (code->maxlength < length) {
    code->maxlength = length;
  }
  if (length < code->minlength) {
    code->minlength = length;
  }
  bit = 0;
  local_34 = length + -1;
  while( true ) {
    if (local_34 < 0) {
      if ((code->tree[bit].branches[0] == -1) && (code->tree[bit].branches[1] == -2)) {
        code->tree[bit].branches[0] = value;
        code->tree[bit].branches[1] = value;
        a_local._4_4_ = 0;
      }
      else {
        archive_set_error(&a->archive,0x54,"Prefix found");
        a_local._4_4_ = -0x1e;
      }
      return a_local._4_4_;
    }
    uVar1 = codebits >> ((byte)local_34 & 0x1f) & 1;
    if (code->tree[bit].branches[0] == code->tree[bit].branches[1]) break;
    if (code->tree[bit].branches[(int)uVar1] < 0) {
      iVar2 = new_node(code);
      if (iVar2 < 0) {
        archive_set_error(&a->archive,0xc,"Unable to allocate memory for node data.");
        return -0x1e;
      }
      iVar2 = code->numentries;
      code->numentries = iVar2 + 1;
      code->tree[bit].branches[(int)uVar1] = iVar2;
    }
    bit = code->tree[bit].branches[(int)uVar1];
    local_34 = local_34 + -1;
  }
  archive_set_error(&a->archive,0x54,"Prefix found");
  return -0x1e;
}

Assistant:

static int
add_value(struct archive_read *a, struct huffman_code *code, int value,
          int codebits, int length)
{
  int lastnode, bitpos, bit;
  /* int repeatpos, repeatnode, nextnode; */

  free(code->table);
  code->table = NULL;

  if(length > code->maxlength)
    code->maxlength = length;
  if(length < code->minlength)
    code->minlength = length;

  /*
   * Dead code, repeatpos was is -1
   *
  repeatpos = -1;
  if (repeatpos == 0 || (repeatpos >= 0
    && (((codebits >> (repeatpos - 1)) & 3) == 0
    || ((codebits >> (repeatpos - 1)) & 3) == 3)))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid repeat position");
    return (ARCHIVE_FATAL);
  }
  */

  lastnode = 0;
  for (bitpos = length - 1; bitpos >= 0; bitpos--)
  {
    bit = (codebits >> bitpos) & 1;

    /* Leaf node check */
    if (code->tree[lastnode].branches[0] ==
      code->tree[lastnode].branches[1])
    {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                        "Prefix found");
      return (ARCHIVE_FATAL);
    }

    /*
     * Dead code, repeatpos was -1, bitpos >=0
     *
    if (bitpos == repeatpos)
    {
      * Open branch check *
      if (!(code->tree[lastnode].branches[bit] < 0))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid repeating code");
        return (ARCHIVE_FATAL);
      }

      if ((repeatnode = new_node(code)) < 0) {
        archive_set_error(&a->archive, ENOMEM,
                          "Unable to allocate memory for node data.");
        return (ARCHIVE_FATAL);
      }
      if ((nextnode = new_node(code)) < 0) {
        archive_set_error(&a->archive, ENOMEM,
                          "Unable to allocate memory for node data.");
        return (ARCHIVE_FATAL);
      }

      * Set branches *
      code->tree[lastnode].branches[bit] = repeatnode;
      code->tree[repeatnode].branches[bit] = repeatnode;
      code->tree[repeatnode].branches[bit^1] = nextnode;
      lastnode = nextnode;

      bitpos++; * terminating bit already handled, skip it *
    }
    else
    {
    */
      /* Open branch check */
      if (code->tree[lastnode].branches[bit] < 0)
      {
        if (new_node(code) < 0) {
          archive_set_error(&a->archive, ENOMEM,
                            "Unable to allocate memory for node data.");
          return (ARCHIVE_FATAL);
        }
        code->tree[lastnode].branches[bit] = code->numentries++;
      }

      /* set to branch */
      lastnode = code->tree[lastnode].branches[bit];
 /* } */
  }

  if (!(code->tree[lastnode].branches[0] == -1
    && code->tree[lastnode].branches[1] == -2))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Prefix found");
    return (ARCHIVE_FATAL);
  }

  /* Set leaf value */
  code->tree[lastnode].branches[0] = value;
  code->tree[lastnode].branches[1] = value;

  return (ARCHIVE_OK);
}